

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gamecontext.cpp
# Opt level: O1

void __thiscall CGameContext::OnTick(CGameContext *this)

{
  int64 *piVar1;
  CPlayer *pCVar2;
  CTuneParam CVar3;
  int iVar4;
  int64 iVar5;
  long lVar6;
  char *pcVar7;
  CTuningParams *pCVar8;
  CWorldCore *pCVar9;
  ulong uVar10;
  ulong uVar11;
  CNetMsg_Sv_VoteStatus *__s;
  int i;
  ulong uVar12;
  char *a;
  long in_FS_OFFSET;
  byte bVar13;
  bool aVoteChecked [64];
  char aaBuf [64] [48];
  int local_c98;
  int local_c94;
  int local_c90;
  int local_c8c;
  char local_c78 [64];
  CNetMsg_Sv_VoteStatus local_c38 [3];
  char local_c08 [3024];
  long local_38;
  
  bVar13 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  CheckPureTuning(this);
  pCVar8 = &this->m_Tuning;
  pCVar9 = &(this->m_World).m_Core;
  for (lVar6 = 0x10; lVar6 != 0; lVar6 = lVar6 + -1) {
    CVar3.m_Value = (pCVar8->m_GroundControlAccel).m_Value;
    (pCVar9->m_Tuning).m_GroundControlSpeed = (CTuneParam)(pCVar8->m_GroundControlSpeed).m_Value;
    (pCVar9->m_Tuning).m_GroundControlAccel = (CTuneParam)CVar3.m_Value;
    pCVar8 = (CTuningParams *)((long)pCVar8 + (ulong)bVar13 * -0x10 + 8);
    pCVar9 = (CWorldCore *)((long)pCVar9 + (ulong)bVar13 * -0x10 + 8);
  }
  CGameWorld::Tick(&this->m_World);
  (*this->m_pController->_vptr_IGameController[10])();
  lVar6 = 0x5e4;
  do {
    pCVar2 = *(CPlayer **)((this->m_NetObjHandler).m_aMsgData + lVar6 * 8 + -0x78);
    if (pCVar2 != (CPlayer *)0x0) {
      CPlayer::Tick(pCVar2);
      CPlayer::PostTick(*(CPlayer **)((this->m_NetObjHandler).m_aMsgData + lVar6 * 8 + -0x78));
    }
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x624);
  piVar1 = &this->m_VoteCloseTime;
  if (this->m_VoteCloseTime == -1) {
    *piVar1 = 0;
    this->m_VoteCancelTime = 0;
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      SendVoteSet(this,4,-1);
      return;
    }
    goto LAB_0011b74e;
  }
  if (this->m_VoteCloseTime != 0) {
    uVar12 = 0;
    local_c90 = 0;
    local_c94 = 0;
    if (this->m_VoteUpdate == true) {
      __s = local_c38;
      uVar12 = 0;
      memset(__s,0,0xc00);
      do {
        if (this->m_apPlayers[uVar12] != (CPlayer *)0x0) {
          (*(this->m_pServer->super_IInterface)._vptr_IInterface[7])
                    (this->m_pServer,uVar12 & 0xffffffff,__s,0x30);
        }
        uVar12 = uVar12 + 1;
        __s = __s + 3;
      } while (uVar12 != 0x40);
      local_c78[0x30] = '\0';
      local_c78[0x31] = '\0';
      local_c78[0x32] = '\0';
      local_c78[0x33] = '\0';
      local_c78[0x34] = '\0';
      local_c78[0x35] = '\0';
      local_c78[0x36] = '\0';
      local_c78[0x37] = '\0';
      local_c78[0x38] = '\0';
      local_c78[0x39] = '\0';
      local_c78[0x3a] = '\0';
      local_c78[0x3b] = '\0';
      local_c78[0x3c] = '\0';
      local_c78[0x3d] = '\0';
      local_c78[0x3e] = '\0';
      local_c78[0x3f] = '\0';
      local_c78[0x20] = '\0';
      local_c78[0x21] = '\0';
      local_c78[0x22] = '\0';
      local_c78[0x23] = '\0';
      local_c78[0x24] = '\0';
      local_c78[0x25] = '\0';
      local_c78[0x26] = '\0';
      local_c78[0x27] = '\0';
      local_c78[0x28] = '\0';
      local_c78[0x29] = '\0';
      local_c78[0x2a] = '\0';
      local_c78[0x2b] = '\0';
      local_c78[0x2c] = '\0';
      local_c78[0x2d] = '\0';
      local_c78[0x2e] = '\0';
      local_c78[0x2f] = '\0';
      local_c78[0x10] = '\0';
      local_c78[0x11] = '\0';
      local_c78[0x12] = '\0';
      local_c78[0x13] = '\0';
      local_c78[0x14] = '\0';
      local_c78[0x15] = '\0';
      local_c78[0x16] = '\0';
      local_c78[0x17] = '\0';
      local_c78[0x18] = '\0';
      local_c78[0x19] = '\0';
      local_c78[0x1a] = '\0';
      local_c78[0x1b] = '\0';
      local_c78[0x1c] = '\0';
      local_c78[0x1d] = '\0';
      local_c78[0x1e] = '\0';
      local_c78[0x1f] = '\0';
      local_c78[0] = '\0';
      local_c78[1] = '\0';
      local_c78[2] = '\0';
      local_c78[3] = '\0';
      local_c78[4] = '\0';
      local_c78[5] = '\0';
      local_c78[6] = '\0';
      local_c78[7] = '\0';
      local_c78[8] = '\0';
      local_c78[9] = '\0';
      local_c78[10] = '\0';
      local_c78[0xb] = '\0';
      local_c78[0xc] = '\0';
      local_c78[0xd] = '\0';
      local_c78[0xe] = '\0';
      local_c78[0xf] = '\0';
      uVar11 = 0;
      pcVar7 = local_c08;
      local_c94 = 0;
      local_c90 = 0;
      uVar12 = 0;
      do {
        pCVar2 = this->m_apPlayers[uVar11];
        if (((pCVar2 != (CPlayer *)0x0) && (pCVar2->m_Team != -1)) && (local_c78[uVar11] == '\0')) {
          local_c98 = pCVar2->m_Vote;
          if (uVar11 < 0x3f) {
            local_c8c = pCVar2->m_VotePos;
            uVar10 = uVar11;
            a = pcVar7;
            do {
              if (((this->m_apPlayers[uVar10 + 1] != (CPlayer *)0x0) &&
                  (local_c78[uVar10 + 1] == '\0')) &&
                 (iVar4 = str_comp(a,(char *)(local_c38 + uVar11 * 3)), iVar4 == 0)) {
                local_c78[uVar10 + 1] = '\x01';
                pCVar2 = this->m_apPlayers[uVar10 + 1];
                if ((pCVar2->m_Vote != 0) && ((local_c98 == 0 || (pCVar2->m_VotePos < local_c8c))))
                {
                  local_c8c = pCVar2->m_VotePos;
                  local_c98 = pCVar2->m_Vote;
                }
              }
              uVar10 = uVar10 + 1;
              a = a + 0x30;
            } while (uVar10 != 0x3f);
          }
          uVar12 = (ulong)((int)uVar12 + 1);
          if (local_c98 < 1) {
            local_c94 = (local_c94 + 1) - (uint)(local_c98 == 0);
          }
          else {
            local_c90 = local_c90 + 1;
          }
        }
        uVar11 = uVar11 + 1;
        pcVar7 = pcVar7 + 0x30;
      } while (uVar11 != 0x40);
    }
    if (this->m_VoteEnforce == 1) {
LAB_0011b5cb:
      (*(this->m_pServer->super_IInterface)._vptr_IInterface[0x12])(this->m_pServer,0xfffffffe);
      (*(this->m_pConsole->super_IInterface)._vptr_IInterface[0x13])
                (this->m_pConsole,this->m_aVoteCommand);
      (*(this->m_pServer->super_IInterface)._vptr_IInterface[0x12])(this->m_pServer,0xffffffff);
      if (((long)this->m_VoteCreator != -1) &&
         (this->m_apPlayers[this->m_VoteCreator] != (CPlayer *)0x0)) {
        this->m_apPlayers[this->m_VoteCreator]->m_LastVoteCallTick = 0;
      }
      *piVar1 = 0;
      this->m_VoteCancelTime = 0;
      if (this->m_VoteEnforce == 1) {
        this->m_VoteCreator = -1;
      }
      iVar4 = 5;
    }
    else {
      iVar4 = (int)uVar12;
      if ((this->m_VoteUpdate == true) && ((int)(uVar12 >> 0x1f) + iVar4 >> 1 < local_c90))
      goto LAB_0011b5cb;
      if ((this->m_VoteEnforce != -1) &&
         (((this->m_VoteUpdate == false || (local_c94 < (iVar4 - (iVar4 + 1 >> 0x1f)) + 1 >> 1)) &&
          (iVar5 = time_get(), iVar5 <= *piVar1)))) {
        if (this->m_VoteUpdate == true) {
          this->m_VoteUpdate = false;
          local_c38[0].m_No = local_c94;
          local_c38[0].m_Yes = local_c90;
          local_c38[0].m_Total = iVar4;
          local_c38[0].m_Pass = iVar4 - (local_c90 + local_c94);
          IServer::SendPackMsg<CNetMsg_Sv_VoteStatus>(this->m_pServer,local_c38,1,-1);
        }
        goto LAB_0011b6e5;
      }
      *piVar1 = 0;
      this->m_VoteCancelTime = 0;
      if (this->m_VoteEnforce == -1) {
        this->m_VoteCreator = -1;
      }
      iVar4 = 6;
    }
    SendVoteSet(this,iVar4,-1);
  }
LAB_0011b6e5:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_0011b74e:
  __stack_chk_fail();
}

Assistant:

void CGameContext::OnTick()
{
	// check tuning
	CheckPureTuning();

	// copy tuning
	m_World.m_Core.m_Tuning = m_Tuning;
	m_World.Tick();

	//if(world.paused) // make sure that the game object always updates
	m_pController->Tick();

	for(int i = 0; i < MAX_CLIENTS; i++)
	{
		if(m_apPlayers[i])
		{
			m_apPlayers[i]->Tick();
			m_apPlayers[i]->PostTick();
		}
	}

	// update voting
	if(m_VoteCloseTime)
	{
		// abort the kick-vote on player-leave
		if(m_VoteCloseTime == -1)
			EndVote(VOTE_END_ABORT, false);
		else
		{
			int Total = 0, Yes = 0, No = 0;
			if(m_VoteUpdate)
			{
				// count votes
				char aaBuf[MAX_CLIENTS][NETADDR_MAXSTRSIZE] = {{0}};
				for(int i = 0; i < MAX_CLIENTS; i++)
					if(m_apPlayers[i])
						Server()->GetClientAddr(i, aaBuf[i], NETADDR_MAXSTRSIZE);
				bool aVoteChecked[MAX_CLIENTS] = {0};
				for(int i = 0; i < MAX_CLIENTS; i++)
				{
					if(!m_apPlayers[i] || m_apPlayers[i]->GetTeam() == TEAM_SPECTATORS || aVoteChecked[i])	// don't count in votes by spectators
						continue;

					int ActVote = m_apPlayers[i]->m_Vote;
					int ActVotePos = m_apPlayers[i]->m_VotePos;

					// check for more players with the same ip (only use the vote of the one who voted first)
					for(int j = i+1; j < MAX_CLIENTS; ++j)
					{
						if(!m_apPlayers[j] || aVoteChecked[j] || str_comp(aaBuf[j], aaBuf[i]))
							continue;

						aVoteChecked[j] = true;
						if(m_apPlayers[j]->m_Vote && (!ActVote || ActVotePos > m_apPlayers[j]->m_VotePos))
						{
							ActVote = m_apPlayers[j]->m_Vote;
							ActVotePos = m_apPlayers[j]->m_VotePos;
						}
					}

					Total++;
					if(ActVote > 0)
						Yes++;
					else if(ActVote < 0)
						No++;
				}
			}

			if(m_VoteEnforce == VOTE_CHOICE_YES || (m_VoteUpdate && Yes >= Total/2+1))
			{
				Server()->SetRconCID(IServer::RCON_CID_VOTE);
				Console()->ExecuteLine(m_aVoteCommand);
				Server()->SetRconCID(IServer::RCON_CID_SERV);
				if(m_VoteCreator != -1 && m_apPlayers[m_VoteCreator])
					m_apPlayers[m_VoteCreator]->m_LastVoteCallTick = 0;

				EndVote(VOTE_END_PASS, m_VoteEnforce == VOTE_CHOICE_YES);
			}
			else if(m_VoteEnforce == VOTE_CHOICE_NO || (m_VoteUpdate && No >= (Total+1)/2) || time_get() > m_VoteCloseTime)
				EndVote(VOTE_END_FAIL, m_VoteEnforce == VOTE_CHOICE_NO);
			else if(m_VoteUpdate)
			{
				m_VoteUpdate = false;
				SendVoteStatus(-1, Total, Yes, No);
			}
		}
	}


#ifdef CONF_DEBUG
	for(int i = 0; i < MAX_CLIENTS; i++)
	{
		if(m_apPlayers[i] && m_apPlayers[i]->IsDummy())
		{
			CNetObj_PlayerInput Input = {0};
			Input.m_Direction = (i&1)?-1:1;
			m_apPlayers[i]->OnPredictedInput(&Input);
		}
	}
#endif
}